

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

GLchar * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::casesToStr(LineContinuationTest *this,CASES cases)

{
  if (cases < DEBUG_CASE) {
    return &DAT_01a79384 + *(int *)(&DAT_01a79384 + (ulong)cases * 4);
  }
  return "nowhere at all. This is debug!";
}

Assistant:

const GLchar* LineContinuationTest::casesToStr(CASES cases) const
{
	const GLchar* result = 0;
	switch (cases)
	{
	case ASSIGNMENT_BEFORE_OPERATOR:
		result = "just before assignment operator";
		break;
	case ASSIGNMENT_AFTER_OPERATOR:
		result = "just after assignment operator";
		break;
	case VECTOR_VARIABLE_INITIALIZER:
		result = "inside vector variable initializer";
		break;
	case TOKEN_INSIDE_FUNCTION_NAME:
		result = "inside function name";
		break;
	case TOKEN_INSIDE_TYPE_NAME:
		result = "inside type name";
		break;
	case TOKEN_INSIDE_VARIABLE_NAME:
		result = "inside variable name";
		break;
	case PREPROCESSOR_TOKEN_INSIDE:
		result = "inside preprocessor token";
		break;
	case PREPROCESSOR_TOKEN_BETWEEN:
		result = "between preprocessor token";
		break;
	case COMMENT:
		result = "inside comment";
		break;
	case SOURCE_TERMINATION_NULL:
		result = "just before null terminating source";
		break;
	case SOURCE_TERMINATION_NON_NULL:
		result = "as last character in source string, without null termination";
		break;
	case PART_TERMINATION_NULL:
		result = "just before null terminating part of source";
		break;
	case PART_NEXT_TO_TERMINATION_NULL:
		result = "just before last character in part of source";
		break;
	case PART_TERMINATION_NON_NULL:
		result = "as last character in part string, without null termination";
		break;
	case PART_NEXT_TO_TERMINATION_NON_NULL:
		result = "just before last character in part string, without null termination";
		break;
	case DEBUG_CASE: /* intended fall through */
	default:
		result = "nowhere at all. This is debug!";
		break;
	}

	return result;
}